

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::declare_temporary_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t result_type,uint32_t result_id
          )

{
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_01;
  ulong uVar1;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar2;
  size_t sVar3;
  SPIRType *type;
  mapped_type *pmVar4;
  size_type sVar5;
  mapped_type *name;
  SPIRBlock *pSVar6;
  undefined1 *puVar7;
  char (*pacVar8) [4];
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar9;
  __hashtable *__h;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar10;
  long lVar11;
  __node_gen_type __node_gen;
  TypedID<(spirv_cross::Types)0> local_84;
  string *local_80;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_78 [2];
  undefined1 local_68 [16];
  __node_base local_58;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  local_84.id = result_id;
  local_80 = __return_storage_ptr__;
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    result_type);
  this_00 = &(this->super_Compiler).ir.meta;
  local_78[0] = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)CONCAT44(local_78[0]._4_4_,local_84.id);
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)this_00,(key_type *)local_78);
  if (this->current_continue_block == (SPIRBlock *)0x0) {
LAB_001c5cec:
    sVar5 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_Compiler).hoisted_temporaries._M_h,&local_84.id);
    if (sVar5 == 0) {
      local_78[0] = (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)CONCAT44(local_78[0]._4_4_,local_84.id);
      name = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_00,(key_type *)local_78);
      add_variable(this,&this->local_variable_names,&this->block_names,(string *)name);
      local_58._M_nxt =
           (_Hash_node_base *)
           flags_to_qualifiers_glsl(this,type,&(pmVar4->decoration).decoration_flags);
      (*(this->super_Compiler)._vptr_Compiler[6])(local_50,this,(ulong)local_84.id,1);
      pacVar8 = (char (*) [4])0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x1a])(local_78,this,type,local_50);
      join<char_const*,std::__cxx11::string,char_const(&)[4]>
                (local_80,(spirv_cross *)&local_58,(char **)local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f7937,
                 pacVar8);
      if (local_78[0] !=
          (_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
           *)local_68) {
        operator_delete(local_78[0]);
      }
      puVar7 = local_40;
      goto LAB_001c5f66;
    }
    pacVar8 = (char (*) [4])0x1;
    (*(this->super_Compiler)._vptr_Compiler[6])((spirv_cross *)local_78,this,(ulong)local_84.id);
    join<std::__cxx11::string,char_const(&)[4]>
              (local_80,(spirv_cross *)local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f7937,pacVar8
              );
  }
  else {
    this_01 = &(this->super_Compiler).hoisted_temporaries;
    sVar5 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&this_01->_M_h,&local_84.id);
    if (sVar5 != 0) goto LAB_001c5cec;
    pSVar6 = Variant::get<spirv_cross::SPIRBlock>
                       ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                        (this->current_continue_block->loop_dominator).id);
    ppVar9 = (pSVar6->declare_temporary).
             super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
             .ptr;
    uVar1 = (pSVar6->declare_temporary).
            super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
            .buffer_size;
    ppVar2 = ppVar9 + uVar1;
    ppVar10 = ppVar9;
    if (0 < (long)uVar1 >> 2) {
      ppVar10 = ppVar9 + (uVar1 & 0xfffffffffffffffc);
      lVar11 = ((long)uVar1 >> 2) + 1;
      ppVar9 = ppVar9 + 2;
      do {
        if ((ppVar9[-2].first.id == result_type) && (ppVar9[-2].second.id == local_84.id)) {
          ppVar9 = ppVar9 + -2;
          goto LAB_001c5edb;
        }
        if ((ppVar9[-1].first.id == result_type) && (ppVar9[-1].second.id == local_84.id)) {
          ppVar9 = ppVar9 + -1;
          goto LAB_001c5edb;
        }
        if (((ppVar9->first).id == result_type) && ((ppVar9->second).id == local_84.id))
        goto LAB_001c5edb;
        if ((ppVar9[1].first.id == result_type) && (ppVar9[1].second.id == local_84.id)) {
          ppVar9 = ppVar9 + 1;
          goto LAB_001c5edb;
        }
        lVar11 = lVar11 + -1;
        ppVar9 = ppVar9 + 4;
      } while (1 < lVar11);
    }
    lVar11 = (long)ppVar2 - (long)ppVar10 >> 3;
    if (lVar11 == 1) {
LAB_001c5ec9:
      ppVar9 = ppVar2;
      if (((ppVar10->first).id == result_type) &&
         (ppVar9 = ppVar10, (ppVar10->second).id != local_84.id)) {
        ppVar9 = ppVar2;
      }
    }
    else {
      ppVar9 = ppVar10;
      if (lVar11 == 2) {
LAB_001c5ea5:
        if (((ppVar9->first).id != result_type) || ((ppVar9->second).id != local_84.id)) {
          ppVar10 = ppVar9 + 1;
          goto LAB_001c5ec9;
        }
      }
      else {
        ppVar9 = ppVar2;
        if ((lVar11 == 3) &&
           (((ppVar10->first).id != result_type ||
            (ppVar9 = ppVar10, (ppVar10->second).id != local_84.id)))) {
          ppVar9 = ppVar10 + 1;
          goto LAB_001c5ea5;
        }
      }
    }
LAB_001c5edb:
    if (ppVar9 == ppVar2) {
      SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
      ::reserve(&pSVar6->declare_temporary,uVar1 + 1);
      ppVar2 = (pSVar6->declare_temporary).
               super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
               .ptr;
      sVar3 = (pSVar6->declare_temporary).
              super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
              .buffer_size;
      ppVar2[sVar3].first.id = result_type;
      ppVar2[sVar3].second.id = local_84.id;
      (pSVar6->declare_temporary).
      super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
      .buffer_size = sVar3 + 1;
      local_78[0] = &this_01->_M_h;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)this_01);
      Compiler::force_recompile(&this->super_Compiler);
    }
    pacVar8 = (char (*) [4])0x1;
    (*(this->super_Compiler)._vptr_Compiler[6])((spirv_cross *)local_78,this,(ulong)local_84.id);
    join<std::__cxx11::string,char_const(&)[4]>
              (local_80,(spirv_cross *)local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2f7937,pacVar8
              );
  }
  puVar7 = local_68;
LAB_001c5f66:
  if (*(undefined1 **)(puVar7 + -0x10) != puVar7) {
    operator_delete(*(undefined1 **)(puVar7 + -0x10));
  }
  return local_80;
}

Assistant:

string CompilerGLSL::declare_temporary(uint32_t result_type, uint32_t result_id)
{
	auto &type = get<SPIRType>(result_type);
	auto &flags = ir.meta[result_id].decoration.decoration_flags;

	// If we're declaring temporaries inside continue blocks,
	// we must declare the temporary in the loop header so that the continue block can avoid declaring new variables.
	if (current_continue_block && !hoisted_temporaries.count(result_id))
	{
		auto &header = get<SPIRBlock>(current_continue_block->loop_dominator);
		if (find_if(begin(header.declare_temporary), end(header.declare_temporary),
		            [result_type, result_id](const pair<uint32_t, uint32_t> &tmp) {
			            return tmp.first == result_type && tmp.second == result_id;
		            }) == end(header.declare_temporary))
		{
			header.declare_temporary.emplace_back(result_type, result_id);
			hoisted_temporaries.insert(result_id);
			force_recompile();
		}

		return join(to_name(result_id), " = ");
	}
	else if (hoisted_temporaries.count(result_id))
	{
		// The temporary has already been declared earlier, so just "declare" the temporary by writing to it.
		return join(to_name(result_id), " = ");
	}
	else
	{
		// The result_id has not been made into an expression yet, so use flags interface.
		add_local_variable_name(result_id);
		return join(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(result_id)), " = ");
	}
}